

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

archive_read_filter * get_filter(archive *_a,int n)

{
  archive_read_filter *paVar1;
  archive_read_filter *paVar2;
  
  paVar2 = (archive_read_filter *)_a[8].compression_name;
  if (paVar2 != (archive_read_filter *)0x0 && n == -1) {
    do {
      paVar1 = paVar2;
      paVar2 = paVar2->upstream;
    } while (paVar2 != (archive_read_filter *)0x0);
    return paVar1;
  }
  if (-1 < n) {
    for (; (0 < n && (paVar2 != (archive_read_filter *)0x0)); paVar2 = paVar2->upstream) {
      n = n + -1;
    }
    return paVar2;
  }
  return (archive_read_filter *)0x0;
}

Assistant:

static struct archive_read_filter *
get_filter(struct archive *_a, int n)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *f = a->filter;
	/* We use n == -1 for 'the last filter', which is always the
	 * client proxy. */
	if (n == -1 && f != NULL) {
		struct archive_read_filter *last = f;
		f = f->upstream;
		while (f != NULL) {
			last = f;
			f = f->upstream;
		}
		return (last);
	}
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->upstream;
		--n;
	}
	return (f);
}